

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

void __thiscall
SortedList<MessageQueue::ListEntry>::Insert
          (SortedList<MessageQueue::ListEntry> *this,ListEntry *data)

{
  bool bVar1;
  DListNode<MessageQueue::ListEntry> *this_00;
  DListNode<MessageQueue::ListEntry> *local_40;
  DListNode<MessageQueue::ListEntry> *prev;
  DListNode<MessageQueue::ListEntry> *node;
  DListNode<MessageQueue::ListEntry> *curr;
  ListEntry *data_local;
  SortedList<MessageQueue::ListEntry> *this_local;
  
  node = this->head;
  this_00 = (DListNode<MessageQueue::ListEntry> *)operator_new(0x20);
  DListNode<MessageQueue::ListEntry>::DListNode(this_00,data);
  local_40 = (DListNode<MessageQueue::ListEntry> *)0x0;
  while ((node != (DListNode<MessageQueue::ListEntry> *)0x0 &&
         (bVar1 = MessageQueue::ListEntry::LessThan(data,&node->data), !bVar1))) {
    local_40 = node;
    node = node->next;
  }
  InsertAfter(this,this_00,local_40);
  return;
}

Assistant:

void Insert(const T& data)
    {
        DListNode<T>* curr = head;
        DListNode<T>* node = new DListNode<T>(data);
        DListNode<T>* prev = nullptr; 

        // Now, if we have to insert, we have to insert *after* some node
        while (curr != nullptr)
        {
            if (T::LessThan(data, curr->data))
            {
                break;
            }
            prev = curr;
            curr = curr->next;
        }

        InsertAfter(node, prev);
    }